

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_1::readFloatOrNormTextureWithLookupsAndVerify
               (RenderContext *renderCtx,CallLogWrapper *glLog,deUint32 textureGL,
               TextureType textureType,TextureFormat *textureFormat,IVec3 *textureSize,
               ImageLayerVerifier *verifyLayer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  TestLog *log;
  int i;
  ContextType type;
  GLSLVersion version;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  int iVar6;
  char *__s;
  undefined8 *puVar7;
  long *plVar8;
  TextureFormat *pTVar9;
  undefined4 extraout_var;
  ObjectTraits *traits;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TestError *pTVar10;
  ulong *puVar11;
  Functions *pFVar12;
  TextureFormat TVar13;
  long *plVar14;
  GLenum target;
  undefined8 uVar15;
  ulong uVar16;
  undefined1 auVar17 [8];
  undefined1 uVar18;
  InterfaceVariableInfo *info;
  deUint32 access;
  int x;
  long lVar19;
  uint uVar20;
  vector<float,_std::allocator<float>_> coords;
  Buffer outputBuffer;
  TextureLevel resultSlice;
  ScopedLogSection section;
  BufferMemMap bufMap;
  UniformAccessLogger uniforms;
  PixelBufferAccess resultSliceAccess;
  string glslVersionDeclaration;
  InterfaceVariableInfo valueInfo;
  ShaderProgram program;
  bool local_6b9;
  float local_6b4;
  ulong local_6a0;
  undefined1 local_698 [24];
  undefined8 uStack_680;
  TextureFormat *local_670;
  float local_668;
  deUint32 local_664;
  ulong *local_660;
  long local_658;
  ulong local_650 [2];
  ulong *local_640;
  long local_638;
  ulong local_630;
  long lStack_628;
  ulong *local_620;
  long local_618;
  ulong local_610;
  long lStack_608;
  ulong *local_600;
  long local_5f8;
  ulong local_5f0;
  long lStack_5e8;
  ulong *local_5e0;
  long local_5d8;
  ulong local_5d0;
  long lStack_5c8;
  ulong *local_5c0;
  long local_5b8;
  ulong local_5b0;
  long lStack_5a8;
  long *local_5a0;
  undefined8 local_598;
  long local_590;
  undefined8 uStack_588;
  long *local_580;
  undefined8 local_578;
  long local_570;
  undefined8 uStack_568;
  long *local_560;
  undefined8 local_558;
  long local_550;
  undefined8 uStack_548;
  long *local_540;
  undefined8 local_538;
  long local_530;
  undefined8 uStack_528;
  long *local_520;
  undefined8 local_518;
  long local_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined1 local_4f0 [32];
  long local_4d0;
  long local_4c8;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  ScopedLogSection local_4b0;
  ulong *local_4a8;
  long local_4a0;
  ulong local_498 [2];
  ulong *local_488;
  long local_480;
  ulong local_478 [2];
  ulong *local_468;
  long local_460;
  ulong local_458 [2];
  string local_448;
  string local_428;
  ulong *local_408;
  long local_400;
  ulong local_3f8 [2];
  undefined1 local_3e8 [8];
  undefined4 local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8 [6];
  ios_base local_378 [8];
  ios_base local_370 [264];
  undefined1 local_268 [16];
  GLuint local_258;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_250;
  ulong local_220;
  undefined1 local_218 [16];
  long local_208;
  TextureFormat TStack_200;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [32];
  deUint32 dStack_1a0;
  uint uStack_19c;
  int iStack_198;
  undefined5 uStack_194;
  undefined8 uStack_18f;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  undefined1 local_100 [152];
  GLuint local_68;
  bool local_40;
  
  access = (deUint32)textureSize;
  log = glLog->m_log;
  local_670 = textureFormat;
  local_3e8 = (undefined1  [8])local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Verification","");
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,
             "Result verification (read texture layer-by-layer in compute shader with texture() into SSBO)"
             ,"");
  tcu::ScopedLogSection::ScopedLogSection(&local_4b0,log,(string *)local_3e8,(string *)local_100);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if (local_3e8 != (undefined1  [8])local_3d8) {
    operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
  }
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,__s,(allocator<char> *)local_3e8);
  local_120[0x10] = 0;
  local_120._17_8_ = 0;
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  memset(local_1d0,0,0xac);
  local_660 = local_650;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_660,local_1f0,local_1e8 + (long)local_1f0);
  std::__cxx11::string::append((char *)&local_660);
  iVar3 = textureSize->m_data[0];
  iVar6 = textureSize->m_data[1];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
  std::ostream::operator<<(local_3e8,iVar6 * iVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
  std::ios_base::~ios_base(local_378);
  uVar16 = 0xf;
  if (local_660 != local_650) {
    uVar16 = local_650[0];
  }
  if (uVar16 < (ulong)(local_400 + local_658)) {
    uVar16 = 0xf;
    if (local_408 != local_3f8) {
      uVar16 = local_3f8[0];
    }
    if (uVar16 < (ulong)(local_400 + local_658)) goto LAB_014997f0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_408,0,(char *)0x0,(ulong)local_660);
    uVar18 = (undefined1)local_658;
  }
  else {
LAB_014997f0:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_408);
    uVar18 = (undefined1)local_658;
  }
  local_5a0 = &local_590;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_590 = *plVar8;
    uStack_588 = puVar7[3];
  }
  else {
    local_590 = *plVar8;
    local_5a0 = (long *)*puVar7;
  }
  local_598 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_5a0);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_630 = *puVar11;
    lStack_628 = plVar8[3];
    local_640 = &local_630;
  }
  else {
    local_630 = *puVar11;
    local_640 = (ulong *)*plVar8;
  }
  local_638 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  getShaderSamplerOrImageType_abi_cxx11_
            (&local_428,(Functional *)(ulong)local_670->type,textureType,TEXTURETYPE_CUBE,
             (bool)uVar18);
  uVar16 = 0xf;
  if (local_640 != &local_630) {
    uVar16 = local_630;
  }
  if (uVar16 < local_428._M_string_length + local_638) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      uVar15 = local_428.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_428._M_string_length + local_638) goto LAB_0149993d;
    lVar19 = local_638;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,(ulong)local_640);
    uVar18 = (undefined1)lVar19;
  }
  else {
LAB_0149993d:
    lVar19 = local_638;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_640,(ulong)local_428._M_dataplus._M_p);
    uVar18 = (undefined1)lVar19;
  }
  local_580 = &local_570;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_570 = *plVar8;
    uStack_568 = puVar7[3];
  }
  else {
    local_570 = *plVar8;
    local_580 = (long *)*puVar7;
  }
  local_578 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_580);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_610 = *puVar11;
    lStack_608 = plVar8[3];
    local_620 = &local_610;
  }
  else {
    local_610 = *puVar11;
    local_620 = (ulong *)*plVar8;
  }
  local_618 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  getShaderSamplerOrImageType_abi_cxx11_
            (&local_448,(Functional *)(ulong)local_670->type,textureType,TEXTURETYPE_CUBE,
             (bool)uVar18);
  uVar16 = 0xf;
  if (local_620 != &local_610) {
    uVar16 = local_610;
  }
  if (uVar16 < local_448._M_string_length + local_618) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      uVar15 = local_448.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_448._M_string_length + local_618) goto LAB_01499a8d;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_448,0,(char *)0x0,(ulong)local_620);
  }
  else {
LAB_01499a8d:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_448._M_dataplus._M_p);
  }
  local_560 = &local_550;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_550 = *plVar8;
    uStack_548 = puVar7[3];
  }
  else {
    local_550 = *plVar8;
    local_560 = (long *)*puVar7;
  }
  local_558 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_560);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_5f0 = *puVar11;
    lStack_5e8 = plVar8[3];
    local_600 = &local_5f0;
  }
  else {
    local_5f0 = *puVar11;
    local_600 = (ulong *)*plVar8;
  }
  local_5f8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  iVar3 = textureSize->m_data[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
  std::ostream::operator<<(local_3e8,iVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
  std::ios_base::~ios_base(local_378);
  uVar16 = 0xf;
  if (local_600 != &local_5f0) {
    uVar16 = local_5f0;
  }
  if (uVar16 < (ulong)(local_460 + local_5f8)) {
    uVar16 = 0xf;
    if (local_468 != local_458) {
      uVar16 = local_458[0];
    }
    if (uVar16 < (ulong)(local_460 + local_5f8)) goto LAB_01499c15;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_468,0,(char *)0x0,(ulong)local_600);
  }
  else {
LAB_01499c15:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_468);
  }
  local_540 = &local_530;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_530 = *plVar8;
    uStack_528 = puVar7[3];
  }
  else {
    local_530 = *plVar8;
    local_540 = (long *)*puVar7;
  }
  local_538 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_540);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_5d0 = *puVar11;
    lStack_5c8 = plVar8[3];
    local_5e0 = &local_5d0;
  }
  else {
    local_5d0 = *puVar11;
    local_5e0 = (ulong *)*plVar8;
  }
  local_5d8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  iVar3 = textureSize->m_data[0];
  iVar6 = textureSize->m_data[1];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
  if (textureType == TEXTURETYPE_CUBE) {
    iVar6 = iVar3;
  }
  std::ostream::operator<<(local_3e8,iVar6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
  std::ios_base::~ios_base(local_378);
  uVar16 = 0xf;
  if (local_5e0 != &local_5d0) {
    uVar16 = local_5d0;
  }
  if (uVar16 < (ulong)(local_480 + local_5d8)) {
    uVar16 = 0xf;
    if (local_488 != local_478) {
      uVar16 = local_478[0];
    }
    if (uVar16 < (ulong)(local_480 + local_5d8)) goto LAB_01499daf;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_488,0,(char *)0x0,(ulong)local_5e0);
  }
  else {
LAB_01499daf:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5e0,(ulong)local_488);
  }
  local_520 = &local_510;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_510 = *plVar8;
    uStack_508 = puVar7[3];
  }
  else {
    local_510 = *plVar8;
    local_520 = (long *)*puVar7;
  }
  local_518 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_520);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_5b0 = *puVar11;
    lStack_5a8 = plVar8[3];
    local_5c0 = &local_5b0;
  }
  else {
    local_5b0 = *puVar11;
    local_5c0 = (ulong *)*plVar8;
  }
  local_5b8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  iVar3 = textureSize->m_data[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
  std::ostream::operator<<(local_3e8,iVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
  std::ios_base::~ios_base(local_378);
  uVar16 = 0xf;
  if (local_5c0 != &local_5b0) {
    uVar16 = local_5b0;
  }
  if (uVar16 < (ulong)(local_4a0 + local_5b8)) {
    uVar16 = 0xf;
    if (local_4a8 != local_498) {
      uVar16 = local_498[0];
    }
    if ((ulong)(local_4a0 + local_5b8) <= uVar16) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_4a8,0,(char *)0x0,(ulong)local_5c0);
      goto LAB_01499f5f;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_4a8);
LAB_01499f5f:
  local_698._0_8_ = local_698 + 0x10;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar1) {
    local_698._16_8_ = paVar1->_M_allocated_capacity;
    uStack_680 = puVar7[3];
  }
  else {
    local_698._16_8_ = paVar1->_M_allocated_capacity;
    local_698._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar7;
  }
  local_698._8_8_ = puVar7[1];
  *puVar7 = paVar1;
  puVar7[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  plVar8 = (long *)std::__cxx11::string::append(local_698);
  pFVar12 = (Functions *)(plVar8 + 2);
  if ((Functions *)*plVar8 == pFVar12) {
    local_4f0._0_8_ = pFVar12->activeShaderProgram;
    local_4f0._8_8_ = plVar8[3];
    local_500._0_8_ = (Functions *)(local_500 + 0x10);
  }
  else {
    local_4f0._0_8_ = pFVar12->activeShaderProgram;
    local_500._0_8_ = (Functions *)*plVar8;
  }
  local_500._8_8_ = plVar8[1];
  *plVar8 = (long)pFVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pTVar9 = (TextureFormat *)std::__cxx11::string::append(local_500);
  TVar13 = (TextureFormat)(pTVar9 + 2);
  if (*pTVar9 == TVar13) {
    local_208 = *(long *)TVar13;
    TStack_200 = pTVar9[3];
    local_218._0_8_ = &local_208;
  }
  else {
    local_208 = *(long *)TVar13;
    local_218._0_8_ = *pTVar9;
  }
  local_218._8_8_ = pTVar9[1];
  *pTVar9 = TVar13;
  pTVar9[1].order = R;
  pTVar9[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar9[2].order = R;
  local_4f0._16_8_ = glLog;
  plVar8 = (long *)std::__cxx11::string::append(local_218);
  plVar14 = plVar8 + 2;
  if ((long *)*plVar8 == plVar14) {
    local_4c8 = *plVar14;
    uStack_4c0 = (undefined4)plVar8[3];
    uStack_4bc = *(undefined4 *)((long)(plVar8 + 3) + 4);
    local_4f0._24_8_ = &local_4c8;
  }
  else {
    local_4c8 = *plVar14;
    local_4f0._24_8_ = (long *)*plVar8;
  }
  local_4d0 = plVar8[1];
  *plVar8 = (long)plVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_268._0_4_ = 5;
  local_268._8_8_ = &local_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_268 + 8),local_4f0._24_8_,local_4d0 + local_4f0._24_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (local_268._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_268 + 8));
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_100,renderCtx,(ProgramSources *)local_1d0);
  if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)local_268._8_8_ != &local_250) {
    operator_delete((void *)local_268._8_8_,local_250._M_impl._0_8_ + 1);
  }
  if ((long *)local_4f0._24_8_ != &local_4c8) {
    operator_delete((void *)local_4f0._24_8_,local_4c8 + 1);
  }
  if ((long *)local_218._0_8_ != &local_208) {
    operator_delete((void *)local_218._0_8_,local_208 + 1);
  }
  if ((Functions *)local_500._0_8_ != (Functions *)(local_500 + 0x10)) {
    operator_delete((void *)local_500._0_8_,(ulong)(local_4f0._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_698 + 0x10)) {
    operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
  }
  if (local_4a8 != local_498) {
    operator_delete(local_4a8,local_498[0] + 1);
  }
  if (local_5c0 != &local_5b0) {
    operator_delete(local_5c0,local_5b0 + 1);
  }
  if (local_520 != &local_510) {
    operator_delete(local_520,local_510 + 1);
  }
  if (local_488 != local_478) {
    operator_delete(local_488,local_478[0] + 1);
  }
  if (local_5e0 != &local_5d0) {
    operator_delete(local_5e0,local_5d0 + 1);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540,local_530 + 1);
  }
  if (local_468 != local_458) {
    operator_delete(local_468,local_458[0] + 1);
  }
  if (local_600 != &local_5f0) {
    operator_delete(local_600,local_5f0 + 1);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560,local_550 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620,local_610 + 1);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580,local_570 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640,local_630 + 1);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0,local_590 + 1);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408,local_3f8[0] + 1);
  }
  if (local_660 != local_650) {
    operator_delete(local_660,local_650[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar19 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar19));
    uVar15 = local_4f0._16_8_;
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_4f0._16_8_,local_68);
  glu::operator<<(log,(ShaderProgram *)local_100);
  if (local_40 == false) {
    local_3e8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3e0,"// Failure: failed to compile program",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e0);
    std::ios_base::~ios_base(local_370);
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
               ,0x3a4);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  target = 0xffffffff;
  if (textureType < TEXTURETYPE_LAST) {
    target = *(GLenum *)(&DAT_01c93968 + (ulong)textureType * 4);
  }
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_500,(Functions *)CONCAT44(extraout_var,iVar3),traits);
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  local_268._0_8_ = CONCAT44(extraout_var_00,iVar3);
  local_250._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_250._M_impl.super__Rb_tree_header._M_header;
  local_258 = local_68;
  local_250._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_250._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268._8_8_ = log;
  local_250._M_impl.super__Rb_tree_header._M_header._M_right =
       local_250._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)uVar15,0x84c0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)uVar15,target,textureGL);
  setTexParameteri((CallLogWrapper *)uVar15,target);
  local_3e8 = (undefined1  [8])local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texture","");
  UniformAccessLogger::assign1i((UniformAccessLogger *)local_268,(string *)local_3e8,0);
  if (local_3e8 != (undefined1  [8])local_3d8) {
    operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
  }
  GVar4 = glu::CallLogWrapper::glGetProgramResourceIndex
                    ((CallLogWrapper *)uVar15,local_68,0x92e6,"Output");
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  dVar5 = glu::getProgramResourceUint
                    ((Functions *)CONCAT44(extraout_var_01,iVar3),local_68,0x92e6,GVar4,0x9303);
  local_3e8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3e0,"// Got buffer data size = ",0x1a);
  std::ostream::operator<<((ostringstream *)&local_3e0,dVar5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e0);
  std::ios_base::~ios_base(local_370);
  if ((int)dVar5 < 1) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,(char *)0x0,"blockSize > 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
               ,0x3ba);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)uVar15,0x90d2,local_4f0._0_4_);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)uVar15,0x90d2,(ulong)dVar5,(void *)0x0,0x88e1)
  ;
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)uVar15,0x90d2,0,local_4f0._0_4_);
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  dVar5 = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
  glu::checkError(dVar5,"SSB setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x3bf);
  uVar20 = 6;
  if (textureType != TEXTURETYPE_CUBE) {
    uVar20 = textureSize->m_data[2];
  }
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)(local_4f0 + 0x18),local_670,textureSize->m_data[0],
             textureSize->m_data[1],1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_218,(TextureLevel *)(local_4f0 + 0x18));
  GVar4 = glu::CallLogWrapper::glGetProgramResourceIndex
                    ((CallLogWrapper *)uVar15,local_68,0x92e6,"Output");
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  local_664 = glu::getProgramResourceUint
                        ((Functions *)CONCAT44(extraout_var_03,iVar3),local_68,0x92e6,GVar4,0x9303);
  GVar4 = glu::CallLogWrapper::glGetProgramResourceIndex
                    ((CallLogWrapper *)uVar15,local_68,0x92e5,"Output.color");
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  local_1d0._0_8_ = local_1c0;
  local_1d0._8_8_ = (pointer)0x0;
  local_1c0[0] = '\0';
  local_1c0._16_8_ = &DAT_ffffffffffffffff;
  local_1c0._24_4_ = 0xffffffff;
  local_1c0._28_4_ = 0;
  dStack_1a0 = 0;
  uStack_19c = 0;
  iStack_198 = 0;
  uStack_194 = 0;
  uStack_18f = 0;
  info = (InterfaceVariableInfo *)local_1d0;
  glu::getProgramInterfaceVariableInfo
            ((Functions *)CONCAT44(extraout_var_04,iVar3),local_68,0x92e5,GVar4,info);
  if (dStack_1a0 != textureSize->m_data[1] * textureSize->m_data[0]) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,(char *)0x0,
               "valueInfo.arraySize == (deUint32)(textureSize.x()*textureSize.y())",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
               ,0x3cc);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)uVar15,8);
  local_6b9 = (int)uVar20 < 1;
  if (0 < (int)uVar20) {
    local_668 = (float)(int)uVar20;
    local_220 = (ulong)uVar20;
    local_6a0 = 0;
    do {
      if (textureType == TEXTURETYPE_CUBE) {
        local_698._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_698._8_8_ = (pointer)0x0;
        local_698._16_8_ = (pointer)0x0;
        glu::TextureTestUtil::computeQuadTexCoordCube
                  ((vector<float,_std::allocator<float>_> *)local_698,
                   (&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)
                   [local_6a0]);
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texCoordLD","");
        UniformAccessLogger::assign3f
                  ((UniformAccessLogger *)local_268,(string *)local_3e8,*(float *)local_698._0_8_,
                   *(float *)(local_698._0_8_ + 4),*(float *)(local_698._0_8_ + 8));
        if (local_3e8 != (undefined1  [8])local_3d8) {
          operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
        }
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texCoordRD","");
        UniformAccessLogger::assign3f
                  ((UniformAccessLogger *)local_268,(string *)local_3e8,
                   *(float *)(local_698._0_8_ + 0x18),*(float *)(local_698._0_8_ + 0x1c),
                   *(float *)(local_698._0_8_ + 0x20));
        if (local_3e8 != (undefined1  [8])local_3d8) {
          operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
        }
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texCoordLU","");
        UniformAccessLogger::assign3f
                  ((UniformAccessLogger *)local_268,(string *)local_3e8,
                   *(float *)(local_698._0_8_ + 0xc),*(float *)(local_698._0_8_ + 0x10),
                   *(float *)(local_698._0_8_ + 0x14));
        if (local_3e8 != (undefined1  [8])local_3d8) {
          operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
        }
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texCoordRU","");
        UniformAccessLogger::assign3f
                  ((UniformAccessLogger *)local_268,(string *)local_3e8,
                   *(float *)(local_698._0_8_ + 0x24),*(float *)(local_698._0_8_ + 0x28),
                   *(float *)(local_698._0_8_ + 0x2c));
        if (local_3e8 != (undefined1  [8])local_3d8) {
          operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar16 = local_698._16_8_ - local_698._0_8_;
          auVar17 = (undefined1  [8])local_698._0_8_;
LAB_0149ab9e:
          operator_delete((void *)auVar17,uVar16);
        }
      }
      else {
        local_6b4 = (float)(int)local_6a0;
        if (textureType == TEXTURETYPE_3D) {
          local_6b4 = (local_6b4 + 0.5) / local_668;
        }
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texCoordLD","");
        UniformAccessLogger::assign3f
                  ((UniformAccessLogger *)local_268,(string *)local_3e8,0.0,0.0,local_6b4);
        if (local_3e8 != (undefined1  [8])local_3d8) {
          operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
        }
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texCoordRD","");
        UniformAccessLogger::assign3f
                  ((UniformAccessLogger *)local_268,(string *)local_3e8,1.0,0.0,local_6b4);
        if (local_3e8 != (undefined1  [8])local_3d8) {
          operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
        }
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texCoordLU","");
        UniformAccessLogger::assign3f
                  ((UniformAccessLogger *)local_268,(string *)local_3e8,0.0,1.0,local_6b4);
        if (local_3e8 != (undefined1  [8])local_3d8) {
          operator_delete((void *)local_3e8,local_3d8[0]._M_allocated_capacity + 1);
        }
        local_3e8 = (undefined1  [8])local_3d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"u_texCoordRU","");
        UniformAccessLogger::assign3f
                  ((UniformAccessLogger *)local_268,(string *)local_3e8,1.0,1.0,local_6b4);
        if (local_3e8 != (undefined1  [8])local_3d8) {
          uVar16 = local_3d8[0]._M_allocated_capacity + 1;
          auVar17 = local_3e8;
          goto LAB_0149ab9e;
        }
      }
      glu::CallLogWrapper::glDispatchCompute
                ((CallLogWrapper *)local_4f0._16_8_,textureSize->m_data[0],textureSize->m_data[1],1)
      ;
      local_3e8 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3e0,"// Note: mapping buffer and reading color values written",
                 0x38);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e0);
      std::ios_base::~ios_base(local_370);
      iVar3 = (*renderCtx->_vptr_RenderContext[3])();
      BufferMemMap::BufferMemMap
                ((BufferMemMap *)local_3e8,(Functions *)CONCAT44(extraout_var_05,iVar3),0x90d2,
                 local_664,(int)info,access);
      uVar15 = local_3d8[0]._M_allocated_capacity;
      if (0 < textureSize->m_data[1]) {
        iVar3 = 0;
        do {
          iVar6 = textureSize->m_data[0];
          if (0 < iVar6) {
            x = 0;
            do {
              lVar19 = (long)((iVar6 * iVar3 + x) * iStack_198);
              if (local_670->order == RGBA) {
                puVar7 = (undefined8 *)((ulong)uStack_19c + uVar15 + lVar19);
                local_698._0_8_ = *puVar7;
                local_698._8_8_ = puVar7[1];
                info = (InterfaceVariableInfo *)0x0;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_218,(Vec4 *)local_698,x,iVar3,0);
              }
              else if (local_670->order == R) {
                uVar2 = *(undefined4 *)((ulong)uStack_19c + uVar15 + lVar19);
                lVar19 = 0;
                do {
                  *(undefined4 *)(local_698 + lVar19 * 4) = uVar2;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 4);
                info = (InterfaceVariableInfo *)0x0;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_218,(Vec4 *)local_698,x,iVar3,0);
              }
              x = x + 1;
              iVar6 = textureSize->m_data[0];
            } while (x < iVar6);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < textureSize->m_data[1]);
      }
      (*(code *)((TestLog *)((long)local_3e8 + 0x1670))->m_log)(local_3e0);
      iVar3 = (**verifyLayer->_vptr_ImageLayerVerifier)
                        (verifyLayer,log,(PixelBufferAccess *)local_218,local_6a0);
      if ((char)iVar3 == '\0') break;
      local_6a0 = local_6a0 + 1;
      local_6b9 = local_220 <= local_6a0;
    } while (local_6a0 != local_220);
  }
  if ((pointer)local_1d0._0_8_ != (pointer)local_1c0) {
    operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1c0._1_7_,local_1c0[0]) + 1);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)(local_4f0 + 0x18));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_250);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_500);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  tcu::TestLog::endSection(local_4b0.m_log);
  return local_6b9;
}

Assistant:

static bool readFloatOrNormTextureWithLookupsAndVerify (const RenderContext&		renderCtx,
														glu::CallLogWrapper&		glLog,
														deUint32					textureGL,
														TextureType					textureType,
														const TextureFormat&		textureFormat,
														const IVec3&				textureSize,
														const ImageLayerVerifier&	verifyLayer)
{
	DE_ASSERT(!isFormatTypeInteger(textureFormat.type));
	DE_ASSERT(textureType != TEXTURETYPE_BUFFER);

	TestLog& log = glLog.getLog();

	const tcu::ScopedLogSection section(log, "Verification", "Result verification (read texture layer-by-layer in compute shader with texture() into SSBO)");
	const std::string			glslVersionDeclaration = getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

	const glu::ShaderProgram program(renderCtx,
		glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
													"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
													"layout (binding = 0) buffer Output\n"
													"{\n"
													"	vec4 color[" + toString(textureSize.x()*textureSize.y()) + "];\n"
													"} sb_out;\n"
													"\n"
													"precision highp " + getShaderSamplerType(textureFormat.type, textureType) + ";\n"
													"\n"
													"uniform highp " + getShaderSamplerType(textureFormat.type, textureType) + " u_texture;\n"
													"uniform highp vec3 u_texCoordLD;\n"
													"uniform highp vec3 u_texCoordRD;\n"
													"uniform highp vec3 u_texCoordLU;\n"
													"uniform highp vec3 u_texCoordRU;\n"
													"\n"
													"void main (void)\n"
													"{\n"
													"	int gx = int(gl_GlobalInvocationID.x);\n"
													"	int gy = int(gl_GlobalInvocationID.y);\n"
													"	highp float s = (float(gx) + 0.5) / float(" + toString(textureSize.x()) + ");\n"
													"	highp float t = (float(gy) + 0.5) / float(" + toString(textureType == TEXTURETYPE_CUBE ? textureSize.x() : textureSize.y()) + ");\n"
													"	highp vec3 texCoord = u_texCoordLD*(1.0-s)*(1.0-t)\n"
													"	                    + u_texCoordRD*(    s)*(1.0-t)\n"
													"	                    + u_texCoordLU*(1.0-s)*(    t)\n"
													"	                    + u_texCoordRU*(    s)*(    t);\n"
													"	int ndx = gy*" + toString(textureSize.x()) + " + gx;\n"
													"	sb_out.color[ndx] = texture(u_texture, texCoord" + (textureType == TEXTURETYPE_2D ? ".xy" : "") + ");\n"
													"}\n"));

	glLog.glUseProgram(program.getProgram());

	log << program;

	if (!program.isOk())
	{
		log << TestLog::Message << "// Failure: failed to compile program" << TestLog::EndMessage;
		TCU_FAIL("Program compilation failed");
	}

	{
		const deUint32			textureTargetGL		= getGLTextureTarget(textureType);
		const glu::Buffer		outputBuffer		(renderCtx);
		UniformAccessLogger		uniforms			(renderCtx.getFunctions(), log, program.getProgram());

		// Setup texture.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, textureGL);
		setTexParameteri(glLog, textureTargetGL);

		uniforms.assign1i("u_texture", 0);

		// Setup output buffer.
		{
			const deUint32		blockIndex		= glLog.glGetProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= glu::getProgramResourceInt(renderCtx.getFunctions(), program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			log << TestLog::Message << "// Got buffer data size = " << blockSize << TestLog::EndMessage;
			TCU_CHECK(blockSize > 0);

			glLog.glBindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			glLog.glBufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			glLog.glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "SSB setup failed");
		}

		// Dispatch one layer at a time, read back and verify.
		{
			const int							numSlicesOrFaces	= textureType == TEXTURETYPE_CUBE ? 6 : textureSize.z();
			tcu::TextureLevel					resultSlice			(textureFormat, textureSize.x(), textureSize.y());
			const PixelBufferAccess				resultSliceAccess	= resultSlice.getAccess();
			const deUint32						blockIndex			= glLog.glGetProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int							blockSize			= glu::getProgramResourceInt(renderCtx.getFunctions(), program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32						valueIndex			= glLog.glGetProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.color");
			const glu::InterfaceVariableInfo	valueInfo			= glu::getProgramInterfaceVariableInfo(renderCtx.getFunctions(), program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);

			TCU_CHECK(valueInfo.arraySize == (deUint32)(textureSize.x()*textureSize.y()));

			glLog.glMemoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

			for (int sliceOrFaceNdx = 0; sliceOrFaceNdx < numSlicesOrFaces; sliceOrFaceNdx++)
			{
				if (textureType == TEXTURETYPE_CUBE)
				{
					vector<float> coords;
					computeQuadTexCoordCube(coords, glslImageFuncZToCubeFace(sliceOrFaceNdx));
					uniforms.assign3f("u_texCoordLD", coords[3*0 + 0], coords[3*0 + 1], coords[3*0 + 2]);
					uniforms.assign3f("u_texCoordRD", coords[3*2 + 0], coords[3*2 + 1], coords[3*2 + 2]);
					uniforms.assign3f("u_texCoordLU", coords[3*1 + 0], coords[3*1 + 1], coords[3*1 + 2]);
					uniforms.assign3f("u_texCoordRU", coords[3*3 + 0], coords[3*3 + 1], coords[3*3 + 2]);
				}
				else
				{
					const float z = textureType == TEXTURETYPE_3D ?
										((float)sliceOrFaceNdx + 0.5f) / (float)numSlicesOrFaces :
										(float)sliceOrFaceNdx;
					uniforms.assign3f("u_texCoordLD", 0.0f, 0.0f, z);
					uniforms.assign3f("u_texCoordRD", 1.0f, 0.0f, z);
					uniforms.assign3f("u_texCoordLU", 0.0f, 1.0f, z);
					uniforms.assign3f("u_texCoordRU", 1.0f, 1.0f, z);
				}

				glLog.glDispatchCompute(textureSize.x(), textureSize.y(), 1);

				{
					log << TestLog::Message << "// Note: mapping buffer and reading color values written" << TestLog::EndMessage;

					const BufferMemMap bufMap(renderCtx.getFunctions(), GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

					for (int y = 0; y < textureSize.y(); y++)
					for (int x = 0; x < textureSize.x(); x++)
					{
						const int				ndx			= y*textureSize.x() + x;
						const float* const		clrData		= (const float*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*ndx);

						switch (textureFormat.order)
						{
							case TextureFormat::R:		resultSliceAccess.setPixel(Vec4(clrData[0]),											x, y); break;
							case TextureFormat::RGBA:	resultSliceAccess.setPixel(Vec4(clrData[0], clrData[1], clrData[2], clrData[3]),		x, y); break;
							default:
								DE_ASSERT(false);
						}
					}
				}

				if (!verifyLayer(log, resultSliceAccess, sliceOrFaceNdx))
					return false;
			}
		}

		return true;
	}
}